

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButtonPrivate::onMenuTriggered(QToolButtonPrivate *this,QAction *action)

{
  long lVar1;
  bool bVar2;
  QListSpecialMethodsBase<QAction_*> *this_00;
  long in_RSI;
  QToolButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  QToolButton *q;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QListSpecialMethodsBase<QAction_*> *)q_func(in_RDI);
  if (in_RSI != 0) {
    bVar2 = QListSpecialMethodsBase<QAction*>::contains<QAction*>(this_00,(QAction **)in_RDI);
    if (!bVar2) {
      QToolButton::triggered((QToolButton *)0x70b383,(QAction *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButtonPrivate::onMenuTriggered(QAction *action)
{
    Q_Q(QToolButton);
    if (action && !actionsCopy.contains(action))
        emit q->triggered(action);
}